

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi_is_hdr_from_file(FILE *f)

{
  int iVar1;
  long __off;
  FILE *in_RDI;
  stbi__context s;
  int res;
  long pos;
  FILE *in_stack_ffffffffffffff08;
  stbi__context *in_stack_ffffffffffffff10;
  
  __off = ftell(in_RDI);
  stbi__start_file(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  iVar1 = stbi__hdr_test(in_stack_ffffffffffffff10);
  fseek(in_RDI,__off,0);
  return iVar1;
}

Assistant:

STBIDEF int stbi_is_hdr_from_file(FILE *f)
{
   #ifndef STBI_NO_HDR
   long pos = ftell(f);
   int res;
   stbi__context s;
   stbi__start_file(&s,f);
   res = stbi__hdr_test(&s);
   fseek(f, pos, SEEK_SET);
   return res;
   #else
   STBI_NOTUSED(f);
   return 0;
   #endif
}